

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void lore_append_attack(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  random_value *prVar1;
  blow_effect *pbVar2;
  monster_blow *pmVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  player_state_conflict state;
  player_state_conflict state_00;
  player_state_conflict state_01;
  random_value v;
  player *p;
  _Bool _Var8;
  monster_sex_t mVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  uint uVar12;
  int iVar13;
  object *poVar14;
  blow_method **ppbVar15;
  long lVar16;
  uint8_t *puVar17;
  int iVar18;
  ulong uVar19;
  char *pcVar20;
  random_chance *prVar21;
  ulong uVar22;
  random_chance *prVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  bitflag *flags;
  bool bVar27;
  uint8_t *puVar28;
  byte bVar29;
  random_chance c;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined1 in_stack_fffffffffffffcd8 [312];
  int local_1c4;
  random_chance local_170 [39];
  undefined4 local_38;
  
  bVar29 = 0;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x667,
                  "void lore_append_attack(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  mVar9 = lore_monster_sex(race);
  _Var8 = flag_has_dbg(known_flags,0xc,0x1a,"known_flags","RF_NEVER_BLOW");
  uVar22 = (ulong)mVar9;
  if (_Var8) {
    textblock_append(tb,"%s has no physical attacks.  ",
                     *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + uVar22 * 0x10 + 8));
    return;
  }
  if ((ulong)z_info->mon_blows_max == 0) {
    iVar24 = 0;
    iVar25 = 0;
  }
  else {
    ppbVar15 = &race->blow->method;
    uVar19 = 0;
    iVar25 = 0;
    iVar24 = 0;
    do {
      if (*ppbVar15 != (blow_method *)0x0) {
        iVar24 = iVar24 + 1;
        iVar25 = iVar25 + (uint)lore->blow_known[uVar19];
      }
      uVar19 = uVar19 + 1;
      ppbVar15 = ppbVar15 + 6;
    } while (z_info->mon_blows_max != uVar19);
  }
  if (iVar25 == 0) {
    textblock_append_c(tb,'\x03',"Nothing is known about %s attack.  ",
                       *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + uVar22 * 0x10));
    return;
  }
  if (z_info->mon_blows_max == 0) {
    uVar12 = 0;
  }
  else {
    local_1c4 = 99;
    uVar19 = 0;
    iVar18 = 0;
    do {
      pmVar3 = race->blow;
      if ((pmVar3[uVar19].method != (blow_method *)0x0) && (lore->blow_known[uVar19] == true)) {
        prVar1 = &pmVar3[uVar19].dice;
        uVar4._0_4_ = prVar1->base;
        uVar4._4_4_ = prVar1->dice;
        uVar5._0_4_ = pmVar3[uVar19].dice.sides;
        uVar5._4_4_ = pmVar3[uVar19].dice.m_bonus;
        v = *prVar1;
        pcVar6 = (pmVar3[uVar19].effect)->desc;
        if (iVar18 == 0) {
          textblock_append(tb,"%s can ",
                           *(undefined8 *)
                            (lore_pronoun_nominative_lore_pronouns + uVar22 * 0x10 + 8));
        }
        else {
          if (iVar18 < iVar25 + -1) {
            pcVar20 = ", ";
          }
          else {
            pcVar20 = ", and ";
          }
          textblock_append(tb,pcVar20);
        }
        textblock_append(tb,"%s",(race->blow[uVar19].method)->desc);
        if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
          wVar10 = blow_index((race->blow[uVar19].effect)->name);
          textblock_append(tb," to ");
          p = player;
          pbVar2 = blow_effects + wVar10;
          if ((blow_effects[wVar10].lore_attr_resist == '\0') && (pbVar2->lore_attr_immune == '\0'))
          {
LAB_0017a795:
            puVar17 = &pbVar2->lore_attr;
          }
          else {
            puVar28 = &blow_effects[wVar10].lore_attr_resist;
            puVar17 = puVar28;
            if (pbVar2->lore_attr_immune == '\0') {
              pcVar20 = pbVar2->effect_type;
              iVar13 = strcmp(pcVar20,"theft");
              if (iVar13 == 0) {
                puVar17 = &pbVar2->lore_attr;
                if (99 < (int)p->lev + adj_dex_safe[(p->known_state).stat_ind[3]]) {
                  puVar17 = puVar28;
                }
              }
              else {
                iVar13 = strcmp(pcVar20,"drain");
                if (iVar13 == 0) {
                  if (z_info->pack_size == 0) {
                    bVar27 = false;
                  }
                  else {
                    uVar26 = 0;
                    bVar27 = false;
                    do {
                      poVar14 = p->upkeep->inven[uVar26];
                      if (((poVar14 == (object *)0x0) ||
                          (_Var8 = tval_can_have_charges(poVar14), !_Var8)) || (poVar14->pval == 0))
                      {
                        bVar7 = true;
                      }
                      else {
                        bVar27 = true;
                        bVar7 = false;
                      }
                    } while ((bVar7) && (uVar26 = uVar26 + 1, uVar26 < z_info->pack_size));
                  }
                }
                else {
                  iVar13 = strcmp(pcVar20,"eat-food");
                  if (iVar13 != 0) {
                    iVar13 = strcmp(pcVar20,"eat-light");
                    if (iVar13 == 0) {
                      wVar10 = slot_by_name(p,"light");
                      poVar14 = slot_object(p,wVar10);
                      if ((poVar14 != (object *)0x0) && (poVar14->timeout != 0)) {
                        _Var8 = flag_has_dbg(poVar14->flags,6,0x19,"obj->flags","OF_NO_FUEL");
LAB_0017a981:
                        puVar17 = &pbVar2->lore_attr;
                        if (_Var8 != false) {
                          puVar17 = puVar28;
                        }
                      }
                    }
                    else {
                      iVar13 = strcmp(pcVar20,"element");
                      if (iVar13 == 0) {
                        wVar10 = pbVar2->resist;
                        memcpy(local_170,&p->known_state,0x13c);
                        prVar21 = local_170;
                        prVar23 = (random_chance *)&stack0xfffffffffffffcd8;
                        for (lVar16 = 0x27; lVar16 != 0; lVar16 = lVar16 + -1) {
                          *prVar23 = *prVar21;
                          prVar21 = prVar21 + (ulong)bVar29 * -2 + 1;
                          prVar23 = prVar23 + (ulong)bVar29 * -2 + 1;
                        }
                        state_01.el_info[0x1b].flags = (undefined1)local_38;
                        state_01.el_info[0x1b]._3_1_ = local_38._1_1_;
                        state_01._314_2_ = local_38._2_2_;
                        uVar30 = in_stack_fffffffffffffcd8._202_4_;
                        uVar31 = in_stack_fffffffffffffcd8._206_4_;
                        uVar32 = in_stack_fffffffffffffcd8._210_4_;
                        uVar33 = in_stack_fffffffffffffcd8._214_4_;
                        uVar34 = in_stack_fffffffffffffcd8._218_4_;
                        uVar35 = in_stack_fffffffffffffcd8._222_4_;
                        uVar36 = in_stack_fffffffffffffcd8._226_4_;
                        uVar37 = in_stack_fffffffffffffcd8._230_4_;
                        uVar38 = in_stack_fffffffffffffcd8._234_4_;
                        uVar39 = in_stack_fffffffffffffcd8._238_4_;
                        uVar40 = in_stack_fffffffffffffcd8._242_4_;
                        uVar41 = in_stack_fffffffffffffcd8._246_4_;
                        uVar42 = in_stack_fffffffffffffcd8._250_4_;
                        uVar43 = in_stack_fffffffffffffcd8._254_4_;
                        uVar44 = in_stack_fffffffffffffcd8._258_4_;
                        uVar45 = in_stack_fffffffffffffcd8._262_4_;
                        uVar46 = in_stack_fffffffffffffcd8._266_4_;
                        uVar47 = in_stack_fffffffffffffcd8._270_4_;
                        uVar48 = in_stack_fffffffffffffcd8._274_4_;
                        uVar49 = in_stack_fffffffffffffcd8._278_4_;
                        uVar50 = in_stack_fffffffffffffcd8._282_4_;
                        uVar51 = in_stack_fffffffffffffcd8._286_4_;
                        uVar52 = in_stack_fffffffffffffcd8._290_4_;
                        uVar53 = in_stack_fffffffffffffcd8._294_4_;
                        uVar54 = in_stack_fffffffffffffcd8._298_4_;
                        uVar55 = in_stack_fffffffffffffcd8._302_4_;
                        uVar56 = in_stack_fffffffffffffcd8._306_4_;
                        state_01.stat_add[0] = in_stack_fffffffffffffcd8._0_4_;
                        state_01.stat_add[1] = in_stack_fffffffffffffcd8._4_4_;
                        state_01.stat_add[2] = in_stack_fffffffffffffcd8._8_4_;
                        state_01.stat_add[3] = in_stack_fffffffffffffcd8._12_4_;
                        state_01.stat_add[4] = in_stack_fffffffffffffcd8._16_4_;
                        state_01.stat_ind[0] = in_stack_fffffffffffffcd8._20_4_;
                        state_01.stat_ind[1] = in_stack_fffffffffffffcd8._24_4_;
                        state_01.stat_ind[2] = in_stack_fffffffffffffcd8._28_4_;
                        state_01.stat_ind[3] = in_stack_fffffffffffffcd8._32_4_;
                        state_01.stat_ind[4] = in_stack_fffffffffffffcd8._36_4_;
                        state_01.stat_use[0] = in_stack_fffffffffffffcd8._40_4_;
                        state_01.stat_use[1] = in_stack_fffffffffffffcd8._44_4_;
                        state_01.stat_use[2] = in_stack_fffffffffffffcd8._48_4_;
                        state_01.stat_use[3] = in_stack_fffffffffffffcd8._52_4_;
                        state_01.stat_use[4] = in_stack_fffffffffffffcd8._56_4_;
                        state_01.stat_top[0] = in_stack_fffffffffffffcd8._60_4_;
                        state_01.stat_top[1] = in_stack_fffffffffffffcd8._64_4_;
                        state_01.stat_top[2] = in_stack_fffffffffffffcd8._68_4_;
                        state_01.stat_top[3] = in_stack_fffffffffffffcd8._72_4_;
                        state_01.stat_top[4] = in_stack_fffffffffffffcd8._76_4_;
                        state_01.skills[0] = in_stack_fffffffffffffcd8._80_4_;
                        state_01.skills[1] = in_stack_fffffffffffffcd8._84_4_;
                        state_01.skills[2] = in_stack_fffffffffffffcd8._88_4_;
                        state_01.skills[3] = in_stack_fffffffffffffcd8._92_4_;
                        state_01.skills[4] = in_stack_fffffffffffffcd8._96_4_;
                        state_01.skills[5] = in_stack_fffffffffffffcd8._100_4_;
                        state_01.skills[6] = in_stack_fffffffffffffcd8._104_4_;
                        state_01.skills[7] = in_stack_fffffffffffffcd8._108_4_;
                        state_01.skills[8] = in_stack_fffffffffffffcd8._112_4_;
                        state_01.skills[9] = in_stack_fffffffffffffcd8._116_4_;
                        state_01.speed = in_stack_fffffffffffffcd8._120_4_;
                        state_01.num_blows = in_stack_fffffffffffffcd8._124_4_;
                        state_01.num_shots = in_stack_fffffffffffffcd8._128_4_;
                        state_01.num_moves = in_stack_fffffffffffffcd8._132_4_;
                        state_01.ammo_mult = in_stack_fffffffffffffcd8._136_4_;
                        state_01.ammo_tval = in_stack_fffffffffffffcd8._140_4_;
                        state_01.ac = in_stack_fffffffffffffcd8._144_4_;
                        state_01.dam_red = in_stack_fffffffffffffcd8._148_4_;
                        state_01.perc_dam_red = in_stack_fffffffffffffcd8._152_4_;
                        state_01.to_a = in_stack_fffffffffffffcd8._156_4_;
                        state_01.to_h = in_stack_fffffffffffffcd8._160_4_;
                        state_01.to_d = in_stack_fffffffffffffcd8._164_4_;
                        state_01.see_infra = in_stack_fffffffffffffcd8._168_4_;
                        state_01.cur_light = in_stack_fffffffffffffcd8._172_4_;
                        state_01.evasion_chance = in_stack_fffffffffffffcd8._176_4_;
                        state_01.shield_on_back = (_Bool)in_stack_fffffffffffffcd8[0xb4];
                        state_01.heavy_wield = (_Bool)in_stack_fffffffffffffcd8[0xb5];
                        state_01.heavy_shoot = (_Bool)in_stack_fffffffffffffcd8[0xb6];
                        state_01.bless_wield = (_Bool)in_stack_fffffffffffffcd8[0xb7];
                        state_01.cumber_armor = (_Bool)in_stack_fffffffffffffcd8[0xb8];
                        state_01.flags[0] = in_stack_fffffffffffffcd8[0xb9];
                        state_01.flags[1] = in_stack_fffffffffffffcd8[0xba];
                        state_01.flags[2] = in_stack_fffffffffffffcd8[0xbb];
                        state_01.flags[3] = in_stack_fffffffffffffcd8[0xbc];
                        state_01.flags[4] = in_stack_fffffffffffffcd8[0xbd];
                        state_01.flags[5] = in_stack_fffffffffffffcd8[0xbe];
                        state_01.pflags[0] = in_stack_fffffffffffffcd8[0xbf];
                        state_01.pflags[1] = in_stack_fffffffffffffcd8[0xc0];
                        state_01.pflags[2] = in_stack_fffffffffffffcd8[0xc1];
                        state_01.pflags[3] = in_stack_fffffffffffffcd8[0xc2];
                        state_01.pflags[4] = in_stack_fffffffffffffcd8[0xc3];
                        state_01.pflags[5] = in_stack_fffffffffffffcd8[0xc4];
                        state_01.pflags[6] = in_stack_fffffffffffffcd8[0xc5];
                        state_01.pflags[7] = in_stack_fffffffffffffcd8[0xc6];
                        state_01.pflags[8] = in_stack_fffffffffffffcd8[199];
                        state_01.pflags[9] = in_stack_fffffffffffffcd8[200];
                        state_01._201_1_ = in_stack_fffffffffffffcd8[0xc9];
                        state_01.el_info[0].res_level = (short)uVar30;
                        state_01.el_info[0].flags = (char)((uint)uVar30 >> 0x10);
                        state_01.el_info[0]._3_1_ = (char)((uint)uVar30 >> 0x18);
                        state_01.el_info[1].res_level = (short)uVar31;
                        state_01.el_info[1].flags = (char)((uint)uVar31 >> 0x10);
                        state_01.el_info[1]._3_1_ = (char)((uint)uVar31 >> 0x18);
                        state_01.el_info[2].res_level = (short)uVar32;
                        state_01.el_info[2].flags = (char)((uint)uVar32 >> 0x10);
                        state_01.el_info[2]._3_1_ = (char)((uint)uVar32 >> 0x18);
                        state_01.el_info[3].res_level = (short)uVar33;
                        state_01.el_info[3].flags = (char)((uint)uVar33 >> 0x10);
                        state_01.el_info[3]._3_1_ = (char)((uint)uVar33 >> 0x18);
                        state_01.el_info[4].res_level = (short)uVar34;
                        state_01.el_info[4].flags = (char)((uint)uVar34 >> 0x10);
                        state_01.el_info[4]._3_1_ = (char)((uint)uVar34 >> 0x18);
                        state_01.el_info[5].res_level = (short)uVar35;
                        state_01.el_info[5].flags = (char)((uint)uVar35 >> 0x10);
                        state_01.el_info[5]._3_1_ = (char)((uint)uVar35 >> 0x18);
                        state_01.el_info[6].res_level = (short)uVar36;
                        state_01.el_info[6].flags = (char)((uint)uVar36 >> 0x10);
                        state_01.el_info[6]._3_1_ = (char)((uint)uVar36 >> 0x18);
                        state_01.el_info[7].res_level = (short)uVar37;
                        state_01.el_info[7].flags = (char)((uint)uVar37 >> 0x10);
                        state_01.el_info[7]._3_1_ = (char)((uint)uVar37 >> 0x18);
                        state_01.el_info[8].res_level = (short)uVar38;
                        state_01.el_info[8].flags = (char)((uint)uVar38 >> 0x10);
                        state_01.el_info[8]._3_1_ = (char)((uint)uVar38 >> 0x18);
                        state_01.el_info[9].res_level = (short)uVar39;
                        state_01.el_info[9].flags = (char)((uint)uVar39 >> 0x10);
                        state_01.el_info[9]._3_1_ = (char)((uint)uVar39 >> 0x18);
                        state_01.el_info[10].res_level = (short)uVar40;
                        state_01.el_info[10].flags = (char)((uint)uVar40 >> 0x10);
                        state_01.el_info[10]._3_1_ = (char)((uint)uVar40 >> 0x18);
                        state_01.el_info[0xb].res_level = (short)uVar41;
                        state_01.el_info[0xb].flags = (char)((uint)uVar41 >> 0x10);
                        state_01.el_info[0xb]._3_1_ = (char)((uint)uVar41 >> 0x18);
                        state_01.el_info[0xc].res_level = (short)uVar42;
                        state_01.el_info[0xc].flags = (char)((uint)uVar42 >> 0x10);
                        state_01.el_info[0xc]._3_1_ = (char)((uint)uVar42 >> 0x18);
                        state_01.el_info[0xd].res_level = (short)uVar43;
                        state_01.el_info[0xd].flags = (char)((uint)uVar43 >> 0x10);
                        state_01.el_info[0xd]._3_1_ = (char)((uint)uVar43 >> 0x18);
                        state_01.el_info[0xe].res_level = (short)uVar44;
                        state_01.el_info[0xe].flags = (char)((uint)uVar44 >> 0x10);
                        state_01.el_info[0xe]._3_1_ = (char)((uint)uVar44 >> 0x18);
                        state_01.el_info[0xf].res_level = (short)uVar45;
                        state_01.el_info[0xf].flags = (char)((uint)uVar45 >> 0x10);
                        state_01.el_info[0xf]._3_1_ = (char)((uint)uVar45 >> 0x18);
                        state_01.el_info[0x10].res_level = (short)uVar46;
                        state_01.el_info[0x10].flags = (char)((uint)uVar46 >> 0x10);
                        state_01.el_info[0x10]._3_1_ = (char)((uint)uVar46 >> 0x18);
                        state_01.el_info[0x11].res_level = (short)uVar47;
                        state_01.el_info[0x11].flags = (char)((uint)uVar47 >> 0x10);
                        state_01.el_info[0x11]._3_1_ = (char)((uint)uVar47 >> 0x18);
                        state_01.el_info[0x12].res_level = (short)uVar48;
                        state_01.el_info[0x12].flags = (char)((uint)uVar48 >> 0x10);
                        state_01.el_info[0x12]._3_1_ = (char)((uint)uVar48 >> 0x18);
                        state_01.el_info[0x13].res_level = (short)uVar49;
                        state_01.el_info[0x13].flags = (char)((uint)uVar49 >> 0x10);
                        state_01.el_info[0x13]._3_1_ = (char)((uint)uVar49 >> 0x18);
                        state_01.el_info[0x14].res_level = (short)uVar50;
                        state_01.el_info[0x14].flags = (char)((uint)uVar50 >> 0x10);
                        state_01.el_info[0x14]._3_1_ = (char)((uint)uVar50 >> 0x18);
                        state_01.el_info[0x15].res_level = (short)uVar51;
                        state_01.el_info[0x15].flags = (char)((uint)uVar51 >> 0x10);
                        state_01.el_info[0x15]._3_1_ = (char)((uint)uVar51 >> 0x18);
                        state_01.el_info[0x16].res_level = (short)uVar52;
                        state_01.el_info[0x16].flags = (char)((uint)uVar52 >> 0x10);
                        state_01.el_info[0x16]._3_1_ = (char)((uint)uVar52 >> 0x18);
                        state_01.el_info[0x17].res_level = (short)uVar53;
                        state_01.el_info[0x17].flags = (char)((uint)uVar53 >> 0x10);
                        state_01.el_info[0x17]._3_1_ = (char)((uint)uVar53 >> 0x18);
                        state_01.el_info[0x18].res_level = (short)uVar54;
                        state_01.el_info[0x18].flags = (char)((uint)uVar54 >> 0x10);
                        state_01.el_info[0x18]._3_1_ = (char)((uint)uVar54 >> 0x18);
                        state_01.el_info[0x19].res_level = (short)uVar55;
                        state_01.el_info[0x19].flags = (char)((uint)uVar55 >> 0x10);
                        state_01.el_info[0x19]._3_1_ = (char)((uint)uVar55 >> 0x18);
                        state_01.el_info[0x1a].res_level = (short)uVar56;
                        state_01.el_info[0x1a].flags = (char)((uint)uVar56 >> 0x10);
                        state_01.el_info[0x1a]._3_1_ = (char)((uint)uVar56 >> 0x18);
                        state_01.el_info[0x1b].res_level = in_stack_fffffffffffffcd8._310_2_;
                        _Var8 = player_resists_effects(state_01,wVar10);
                        goto LAB_0017a981;
                      }
                      iVar13 = strcmp(pcVar20,"flag");
                      if (iVar13 == 0) {
                        _Var8 = flag_has_dbg((p->known_state).flags,6,pbVar2->resist,
                                             "p->known_state.flags","blow->resist");
                        puVar17 = &pbVar2->lore_attr;
                        if (_Var8) {
                          puVar17 = puVar28;
                        }
                      }
                      else {
                        iVar13 = strcmp(pcVar20,"all_sustains");
                        if (iVar13 != 0) goto LAB_0017a795;
                        flags = (p->known_state).flags;
                        _Var8 = flag_has_dbg(flags,6,1,"p->known_state.flags","OF_SUST_STR");
                        if ((((!_Var8) ||
                             (_Var8 = flag_has_dbg(flags,6,2,"p->known_state.flags","OF_SUST_INT"),
                             !_Var8)) ||
                            (_Var8 = flag_has_dbg(flags,6,3,"p->known_state.flags","OF_SUST_WIS"),
                            !_Var8)) ||
                           ((_Var8 = flag_has_dbg(flags,6,4,"p->known_state.flags","OF_SUST_DEX"),
                            !_Var8 || (_Var8 = flag_has_dbg(flags,6,5,"p->known_state.flags",
                                                            "OF_SUST_CON"), !_Var8)))) {
                          puVar17 = &pbVar2->lore_attr;
                        }
                      }
                    }
                    goto LAB_0017a9b1;
                  }
                  if (z_info->pack_size == 0) {
                    bVar27 = false;
                  }
                  else {
                    uVar26 = 0;
                    bVar27 = false;
                    do {
                      poVar14 = p->upkeep->inven[uVar26];
                      if ((poVar14 == (object *)0x0) || (_Var8 = tval_is_edible(poVar14), !_Var8)) {
                        bVar7 = true;
                      }
                      else {
                        bVar27 = true;
                        bVar7 = false;
                      }
                    } while ((bVar7) && (uVar26 = uVar26 + 1, uVar26 < z_info->pack_size));
                  }
                }
                if (bVar27) {
                  puVar17 = &pbVar2->lore_attr;
                }
              }
            }
            else {
              wVar10 = L'\0';
              do {
                wVar11 = proj_name_to_idx(pbVar2->name);
                if (wVar10 == wVar11) goto LAB_0017a639;
                wVar10 = wVar10 + L'\x01';
              } while (wVar10 != L'\x04');
              wVar10 = L'\x04';
LAB_0017a639:
              memcpy(local_170,&p->known_state,0x13c);
              prVar21 = local_170;
              prVar23 = (random_chance *)&stack0xfffffffffffffcd8;
              for (lVar16 = 0x27; lVar16 != 0; lVar16 = lVar16 + -1) {
                *prVar23 = *prVar21;
                prVar21 = prVar21 + (ulong)bVar29 * -2 + 1;
                prVar23 = prVar23 + (ulong)bVar29 * -2 + 1;
              }
              state.el_info[0x1b].flags = (undefined1)local_38;
              state.el_info[0x1b]._3_1_ = local_38._1_1_;
              state._314_2_ = local_38._2_2_;
              uVar30 = in_stack_fffffffffffffcd8._202_4_;
              uVar31 = in_stack_fffffffffffffcd8._206_4_;
              uVar32 = in_stack_fffffffffffffcd8._210_4_;
              uVar33 = in_stack_fffffffffffffcd8._214_4_;
              uVar34 = in_stack_fffffffffffffcd8._218_4_;
              uVar35 = in_stack_fffffffffffffcd8._222_4_;
              uVar36 = in_stack_fffffffffffffcd8._226_4_;
              uVar37 = in_stack_fffffffffffffcd8._230_4_;
              uVar38 = in_stack_fffffffffffffcd8._234_4_;
              uVar39 = in_stack_fffffffffffffcd8._238_4_;
              uVar40 = in_stack_fffffffffffffcd8._242_4_;
              uVar41 = in_stack_fffffffffffffcd8._246_4_;
              uVar42 = in_stack_fffffffffffffcd8._250_4_;
              uVar43 = in_stack_fffffffffffffcd8._254_4_;
              uVar44 = in_stack_fffffffffffffcd8._258_4_;
              uVar45 = in_stack_fffffffffffffcd8._262_4_;
              uVar46 = in_stack_fffffffffffffcd8._266_4_;
              uVar47 = in_stack_fffffffffffffcd8._270_4_;
              uVar48 = in_stack_fffffffffffffcd8._274_4_;
              uVar49 = in_stack_fffffffffffffcd8._278_4_;
              uVar50 = in_stack_fffffffffffffcd8._282_4_;
              uVar51 = in_stack_fffffffffffffcd8._286_4_;
              uVar52 = in_stack_fffffffffffffcd8._290_4_;
              uVar53 = in_stack_fffffffffffffcd8._294_4_;
              uVar54 = in_stack_fffffffffffffcd8._298_4_;
              uVar55 = in_stack_fffffffffffffcd8._302_4_;
              uVar56 = in_stack_fffffffffffffcd8._306_4_;
              state.stat_add[0] = in_stack_fffffffffffffcd8._0_4_;
              state.stat_add[1] = in_stack_fffffffffffffcd8._4_4_;
              state.stat_add[2] = in_stack_fffffffffffffcd8._8_4_;
              state.stat_add[3] = in_stack_fffffffffffffcd8._12_4_;
              state.stat_add[4] = in_stack_fffffffffffffcd8._16_4_;
              state.stat_ind[0] = in_stack_fffffffffffffcd8._20_4_;
              state.stat_ind[1] = in_stack_fffffffffffffcd8._24_4_;
              state.stat_ind[2] = in_stack_fffffffffffffcd8._28_4_;
              state.stat_ind[3] = in_stack_fffffffffffffcd8._32_4_;
              state.stat_ind[4] = in_stack_fffffffffffffcd8._36_4_;
              state.stat_use[0] = in_stack_fffffffffffffcd8._40_4_;
              state.stat_use[1] = in_stack_fffffffffffffcd8._44_4_;
              state.stat_use[2] = in_stack_fffffffffffffcd8._48_4_;
              state.stat_use[3] = in_stack_fffffffffffffcd8._52_4_;
              state.stat_use[4] = in_stack_fffffffffffffcd8._56_4_;
              state.stat_top[0] = in_stack_fffffffffffffcd8._60_4_;
              state.stat_top[1] = in_stack_fffffffffffffcd8._64_4_;
              state.stat_top[2] = in_stack_fffffffffffffcd8._68_4_;
              state.stat_top[3] = in_stack_fffffffffffffcd8._72_4_;
              state.stat_top[4] = in_stack_fffffffffffffcd8._76_4_;
              state.skills[0] = in_stack_fffffffffffffcd8._80_4_;
              state.skills[1] = in_stack_fffffffffffffcd8._84_4_;
              state.skills[2] = in_stack_fffffffffffffcd8._88_4_;
              state.skills[3] = in_stack_fffffffffffffcd8._92_4_;
              state.skills[4] = in_stack_fffffffffffffcd8._96_4_;
              state.skills[5] = in_stack_fffffffffffffcd8._100_4_;
              state.skills[6] = in_stack_fffffffffffffcd8._104_4_;
              state.skills[7] = in_stack_fffffffffffffcd8._108_4_;
              state.skills[8] = in_stack_fffffffffffffcd8._112_4_;
              state.skills[9] = in_stack_fffffffffffffcd8._116_4_;
              state.speed = in_stack_fffffffffffffcd8._120_4_;
              state.num_blows = in_stack_fffffffffffffcd8._124_4_;
              state.num_shots = in_stack_fffffffffffffcd8._128_4_;
              state.num_moves = in_stack_fffffffffffffcd8._132_4_;
              state.ammo_mult = in_stack_fffffffffffffcd8._136_4_;
              state.ammo_tval = in_stack_fffffffffffffcd8._140_4_;
              state.ac = in_stack_fffffffffffffcd8._144_4_;
              state.dam_red = in_stack_fffffffffffffcd8._148_4_;
              state.perc_dam_red = in_stack_fffffffffffffcd8._152_4_;
              state.to_a = in_stack_fffffffffffffcd8._156_4_;
              state.to_h = in_stack_fffffffffffffcd8._160_4_;
              state.to_d = in_stack_fffffffffffffcd8._164_4_;
              state.see_infra = in_stack_fffffffffffffcd8._168_4_;
              state.cur_light = in_stack_fffffffffffffcd8._172_4_;
              state.evasion_chance = in_stack_fffffffffffffcd8._176_4_;
              state.shield_on_back = (_Bool)in_stack_fffffffffffffcd8[0xb4];
              state.heavy_wield = (_Bool)in_stack_fffffffffffffcd8[0xb5];
              state.heavy_shoot = (_Bool)in_stack_fffffffffffffcd8[0xb6];
              state.bless_wield = (_Bool)in_stack_fffffffffffffcd8[0xb7];
              state.cumber_armor = (_Bool)in_stack_fffffffffffffcd8[0xb8];
              state.flags[0] = in_stack_fffffffffffffcd8[0xb9];
              state.flags[1] = in_stack_fffffffffffffcd8[0xba];
              state.flags[2] = in_stack_fffffffffffffcd8[0xbb];
              state.flags[3] = in_stack_fffffffffffffcd8[0xbc];
              state.flags[4] = in_stack_fffffffffffffcd8[0xbd];
              state.flags[5] = in_stack_fffffffffffffcd8[0xbe];
              state.pflags[0] = in_stack_fffffffffffffcd8[0xbf];
              state.pflags[1] = in_stack_fffffffffffffcd8[0xc0];
              state.pflags[2] = in_stack_fffffffffffffcd8[0xc1];
              state.pflags[3] = in_stack_fffffffffffffcd8[0xc2];
              state.pflags[4] = in_stack_fffffffffffffcd8[0xc3];
              state.pflags[5] = in_stack_fffffffffffffcd8[0xc4];
              state.pflags[6] = in_stack_fffffffffffffcd8[0xc5];
              state.pflags[7] = in_stack_fffffffffffffcd8[0xc6];
              state.pflags[8] = in_stack_fffffffffffffcd8[199];
              state.pflags[9] = in_stack_fffffffffffffcd8[200];
              state._201_1_ = in_stack_fffffffffffffcd8[0xc9];
              state.el_info[0].res_level = (short)uVar30;
              state.el_info[0].flags = (char)((uint)uVar30 >> 0x10);
              state.el_info[0]._3_1_ = (char)((uint)uVar30 >> 0x18);
              state.el_info[1].res_level = (short)uVar31;
              state.el_info[1].flags = (char)((uint)uVar31 >> 0x10);
              state.el_info[1]._3_1_ = (char)((uint)uVar31 >> 0x18);
              state.el_info[2].res_level = (short)uVar32;
              state.el_info[2].flags = (char)((uint)uVar32 >> 0x10);
              state.el_info[2]._3_1_ = (char)((uint)uVar32 >> 0x18);
              state.el_info[3].res_level = (short)uVar33;
              state.el_info[3].flags = (char)((uint)uVar33 >> 0x10);
              state.el_info[3]._3_1_ = (char)((uint)uVar33 >> 0x18);
              state.el_info[4].res_level = (short)uVar34;
              state.el_info[4].flags = (char)((uint)uVar34 >> 0x10);
              state.el_info[4]._3_1_ = (char)((uint)uVar34 >> 0x18);
              state.el_info[5].res_level = (short)uVar35;
              state.el_info[5].flags = (char)((uint)uVar35 >> 0x10);
              state.el_info[5]._3_1_ = (char)((uint)uVar35 >> 0x18);
              state.el_info[6].res_level = (short)uVar36;
              state.el_info[6].flags = (char)((uint)uVar36 >> 0x10);
              state.el_info[6]._3_1_ = (char)((uint)uVar36 >> 0x18);
              state.el_info[7].res_level = (short)uVar37;
              state.el_info[7].flags = (char)((uint)uVar37 >> 0x10);
              state.el_info[7]._3_1_ = (char)((uint)uVar37 >> 0x18);
              state.el_info[8].res_level = (short)uVar38;
              state.el_info[8].flags = (char)((uint)uVar38 >> 0x10);
              state.el_info[8]._3_1_ = (char)((uint)uVar38 >> 0x18);
              state.el_info[9].res_level = (short)uVar39;
              state.el_info[9].flags = (char)((uint)uVar39 >> 0x10);
              state.el_info[9]._3_1_ = (char)((uint)uVar39 >> 0x18);
              state.el_info[10].res_level = (short)uVar40;
              state.el_info[10].flags = (char)((uint)uVar40 >> 0x10);
              state.el_info[10]._3_1_ = (char)((uint)uVar40 >> 0x18);
              state.el_info[0xb].res_level = (short)uVar41;
              state.el_info[0xb].flags = (char)((uint)uVar41 >> 0x10);
              state.el_info[0xb]._3_1_ = (char)((uint)uVar41 >> 0x18);
              state.el_info[0xc].res_level = (short)uVar42;
              state.el_info[0xc].flags = (char)((uint)uVar42 >> 0x10);
              state.el_info[0xc]._3_1_ = (char)((uint)uVar42 >> 0x18);
              state.el_info[0xd].res_level = (short)uVar43;
              state.el_info[0xd].flags = (char)((uint)uVar43 >> 0x10);
              state.el_info[0xd]._3_1_ = (char)((uint)uVar43 >> 0x18);
              state.el_info[0xe].res_level = (short)uVar44;
              state.el_info[0xe].flags = (char)((uint)uVar44 >> 0x10);
              state.el_info[0xe]._3_1_ = (char)((uint)uVar44 >> 0x18);
              state.el_info[0xf].res_level = (short)uVar45;
              state.el_info[0xf].flags = (char)((uint)uVar45 >> 0x10);
              state.el_info[0xf]._3_1_ = (char)((uint)uVar45 >> 0x18);
              state.el_info[0x10].res_level = (short)uVar46;
              state.el_info[0x10].flags = (char)((uint)uVar46 >> 0x10);
              state.el_info[0x10]._3_1_ = (char)((uint)uVar46 >> 0x18);
              state.el_info[0x11].res_level = (short)uVar47;
              state.el_info[0x11].flags = (char)((uint)uVar47 >> 0x10);
              state.el_info[0x11]._3_1_ = (char)((uint)uVar47 >> 0x18);
              state.el_info[0x12].res_level = (short)uVar48;
              state.el_info[0x12].flags = (char)((uint)uVar48 >> 0x10);
              state.el_info[0x12]._3_1_ = (char)((uint)uVar48 >> 0x18);
              state.el_info[0x13].res_level = (short)uVar49;
              state.el_info[0x13].flags = (char)((uint)uVar49 >> 0x10);
              state.el_info[0x13]._3_1_ = (char)((uint)uVar49 >> 0x18);
              state.el_info[0x14].res_level = (short)uVar50;
              state.el_info[0x14].flags = (char)((uint)uVar50 >> 0x10);
              state.el_info[0x14]._3_1_ = (char)((uint)uVar50 >> 0x18);
              state.el_info[0x15].res_level = (short)uVar51;
              state.el_info[0x15].flags = (char)((uint)uVar51 >> 0x10);
              state.el_info[0x15]._3_1_ = (char)((uint)uVar51 >> 0x18);
              state.el_info[0x16].res_level = (short)uVar52;
              state.el_info[0x16].flags = (char)((uint)uVar52 >> 0x10);
              state.el_info[0x16]._3_1_ = (char)((uint)uVar52 >> 0x18);
              state.el_info[0x17].res_level = (short)uVar53;
              state.el_info[0x17].flags = (char)((uint)uVar53 >> 0x10);
              state.el_info[0x17]._3_1_ = (char)((uint)uVar53 >> 0x18);
              state.el_info[0x18].res_level = (short)uVar54;
              state.el_info[0x18].flags = (char)((uint)uVar54 >> 0x10);
              state.el_info[0x18]._3_1_ = (char)((uint)uVar54 >> 0x18);
              state.el_info[0x19].res_level = (short)uVar55;
              state.el_info[0x19].flags = (char)((uint)uVar55 >> 0x10);
              state.el_info[0x19]._3_1_ = (char)((uint)uVar55 >> 0x18);
              state.el_info[0x1a].res_level = (short)uVar56;
              state.el_info[0x1a].flags = (char)((uint)uVar56 >> 0x10);
              state.el_info[0x1a]._3_1_ = (char)((uint)uVar56 >> 0x18);
              state.el_info[0x1b].res_level = in_stack_fffffffffffffcd8._310_2_;
              _Var8 = player_is_immune(state,wVar10);
              puVar17 = &pbVar2->lore_attr_immune;
              if (!_Var8) {
                memcpy(local_170,&p->known_state,0x13c);
                prVar21 = local_170;
                prVar23 = (random_chance *)&stack0xfffffffffffffcd8;
                for (lVar16 = 0x27; lVar16 != 0; lVar16 = lVar16 + -1) {
                  *prVar23 = *prVar21;
                  prVar21 = prVar21 + (ulong)bVar29 * -2 + 1;
                  prVar23 = prVar23 + (ulong)bVar29 * -2 + 1;
                }
                state_00.el_info[0x1b].flags = (undefined1)local_38;
                state_00.el_info[0x1b]._3_1_ = local_38._1_1_;
                state_00._314_2_ = local_38._2_2_;
                uVar30 = in_stack_fffffffffffffcd8._202_4_;
                uVar31 = in_stack_fffffffffffffcd8._206_4_;
                uVar32 = in_stack_fffffffffffffcd8._210_4_;
                uVar33 = in_stack_fffffffffffffcd8._214_4_;
                uVar34 = in_stack_fffffffffffffcd8._218_4_;
                uVar35 = in_stack_fffffffffffffcd8._222_4_;
                uVar36 = in_stack_fffffffffffffcd8._226_4_;
                uVar37 = in_stack_fffffffffffffcd8._230_4_;
                uVar38 = in_stack_fffffffffffffcd8._234_4_;
                uVar39 = in_stack_fffffffffffffcd8._238_4_;
                uVar40 = in_stack_fffffffffffffcd8._242_4_;
                uVar41 = in_stack_fffffffffffffcd8._246_4_;
                uVar42 = in_stack_fffffffffffffcd8._250_4_;
                uVar43 = in_stack_fffffffffffffcd8._254_4_;
                uVar44 = in_stack_fffffffffffffcd8._258_4_;
                uVar45 = in_stack_fffffffffffffcd8._262_4_;
                uVar46 = in_stack_fffffffffffffcd8._266_4_;
                uVar47 = in_stack_fffffffffffffcd8._270_4_;
                uVar48 = in_stack_fffffffffffffcd8._274_4_;
                uVar49 = in_stack_fffffffffffffcd8._278_4_;
                uVar50 = in_stack_fffffffffffffcd8._282_4_;
                uVar51 = in_stack_fffffffffffffcd8._286_4_;
                uVar52 = in_stack_fffffffffffffcd8._290_4_;
                uVar53 = in_stack_fffffffffffffcd8._294_4_;
                uVar54 = in_stack_fffffffffffffcd8._298_4_;
                uVar55 = in_stack_fffffffffffffcd8._302_4_;
                uVar56 = in_stack_fffffffffffffcd8._306_4_;
                state_00.stat_add[0] = in_stack_fffffffffffffcd8._0_4_;
                state_00.stat_add[1] = in_stack_fffffffffffffcd8._4_4_;
                state_00.stat_add[2] = in_stack_fffffffffffffcd8._8_4_;
                state_00.stat_add[3] = in_stack_fffffffffffffcd8._12_4_;
                state_00.stat_add[4] = in_stack_fffffffffffffcd8._16_4_;
                state_00.stat_ind[0] = in_stack_fffffffffffffcd8._20_4_;
                state_00.stat_ind[1] = in_stack_fffffffffffffcd8._24_4_;
                state_00.stat_ind[2] = in_stack_fffffffffffffcd8._28_4_;
                state_00.stat_ind[3] = in_stack_fffffffffffffcd8._32_4_;
                state_00.stat_ind[4] = in_stack_fffffffffffffcd8._36_4_;
                state_00.stat_use[0] = in_stack_fffffffffffffcd8._40_4_;
                state_00.stat_use[1] = in_stack_fffffffffffffcd8._44_4_;
                state_00.stat_use[2] = in_stack_fffffffffffffcd8._48_4_;
                state_00.stat_use[3] = in_stack_fffffffffffffcd8._52_4_;
                state_00.stat_use[4] = in_stack_fffffffffffffcd8._56_4_;
                state_00.stat_top[0] = in_stack_fffffffffffffcd8._60_4_;
                state_00.stat_top[1] = in_stack_fffffffffffffcd8._64_4_;
                state_00.stat_top[2] = in_stack_fffffffffffffcd8._68_4_;
                state_00.stat_top[3] = in_stack_fffffffffffffcd8._72_4_;
                state_00.stat_top[4] = in_stack_fffffffffffffcd8._76_4_;
                state_00.skills[0] = in_stack_fffffffffffffcd8._80_4_;
                state_00.skills[1] = in_stack_fffffffffffffcd8._84_4_;
                state_00.skills[2] = in_stack_fffffffffffffcd8._88_4_;
                state_00.skills[3] = in_stack_fffffffffffffcd8._92_4_;
                state_00.skills[4] = in_stack_fffffffffffffcd8._96_4_;
                state_00.skills[5] = in_stack_fffffffffffffcd8._100_4_;
                state_00.skills[6] = in_stack_fffffffffffffcd8._104_4_;
                state_00.skills[7] = in_stack_fffffffffffffcd8._108_4_;
                state_00.skills[8] = in_stack_fffffffffffffcd8._112_4_;
                state_00.skills[9] = in_stack_fffffffffffffcd8._116_4_;
                state_00.speed = in_stack_fffffffffffffcd8._120_4_;
                state_00.num_blows = in_stack_fffffffffffffcd8._124_4_;
                state_00.num_shots = in_stack_fffffffffffffcd8._128_4_;
                state_00.num_moves = in_stack_fffffffffffffcd8._132_4_;
                state_00.ammo_mult = in_stack_fffffffffffffcd8._136_4_;
                state_00.ammo_tval = in_stack_fffffffffffffcd8._140_4_;
                state_00.ac = in_stack_fffffffffffffcd8._144_4_;
                state_00.dam_red = in_stack_fffffffffffffcd8._148_4_;
                state_00.perc_dam_red = in_stack_fffffffffffffcd8._152_4_;
                state_00.to_a = in_stack_fffffffffffffcd8._156_4_;
                state_00.to_h = in_stack_fffffffffffffcd8._160_4_;
                state_00.to_d = in_stack_fffffffffffffcd8._164_4_;
                state_00.see_infra = in_stack_fffffffffffffcd8._168_4_;
                state_00.cur_light = in_stack_fffffffffffffcd8._172_4_;
                state_00.evasion_chance = in_stack_fffffffffffffcd8._176_4_;
                state_00.shield_on_back = (_Bool)in_stack_fffffffffffffcd8[0xb4];
                state_00.heavy_wield = (_Bool)in_stack_fffffffffffffcd8[0xb5];
                state_00.heavy_shoot = (_Bool)in_stack_fffffffffffffcd8[0xb6];
                state_00.bless_wield = (_Bool)in_stack_fffffffffffffcd8[0xb7];
                state_00.cumber_armor = (_Bool)in_stack_fffffffffffffcd8[0xb8];
                state_00.flags[0] = in_stack_fffffffffffffcd8[0xb9];
                state_00.flags[1] = in_stack_fffffffffffffcd8[0xba];
                state_00.flags[2] = in_stack_fffffffffffffcd8[0xbb];
                state_00.flags[3] = in_stack_fffffffffffffcd8[0xbc];
                state_00.flags[4] = in_stack_fffffffffffffcd8[0xbd];
                state_00.flags[5] = in_stack_fffffffffffffcd8[0xbe];
                state_00.pflags[0] = in_stack_fffffffffffffcd8[0xbf];
                state_00.pflags[1] = in_stack_fffffffffffffcd8[0xc0];
                state_00.pflags[2] = in_stack_fffffffffffffcd8[0xc1];
                state_00.pflags[3] = in_stack_fffffffffffffcd8[0xc2];
                state_00.pflags[4] = in_stack_fffffffffffffcd8[0xc3];
                state_00.pflags[5] = in_stack_fffffffffffffcd8[0xc4];
                state_00.pflags[6] = in_stack_fffffffffffffcd8[0xc5];
                state_00.pflags[7] = in_stack_fffffffffffffcd8[0xc6];
                state_00.pflags[8] = in_stack_fffffffffffffcd8[199];
                state_00.pflags[9] = in_stack_fffffffffffffcd8[200];
                state_00._201_1_ = in_stack_fffffffffffffcd8[0xc9];
                state_00.el_info[0].res_level = (short)uVar30;
                state_00.el_info[0].flags = (char)((uint)uVar30 >> 0x10);
                state_00.el_info[0]._3_1_ = (char)((uint)uVar30 >> 0x18);
                state_00.el_info[1].res_level = (short)uVar31;
                state_00.el_info[1].flags = (char)((uint)uVar31 >> 0x10);
                state_00.el_info[1]._3_1_ = (char)((uint)uVar31 >> 0x18);
                state_00.el_info[2].res_level = (short)uVar32;
                state_00.el_info[2].flags = (char)((uint)uVar32 >> 0x10);
                state_00.el_info[2]._3_1_ = (char)((uint)uVar32 >> 0x18);
                state_00.el_info[3].res_level = (short)uVar33;
                state_00.el_info[3].flags = (char)((uint)uVar33 >> 0x10);
                state_00.el_info[3]._3_1_ = (char)((uint)uVar33 >> 0x18);
                state_00.el_info[4].res_level = (short)uVar34;
                state_00.el_info[4].flags = (char)((uint)uVar34 >> 0x10);
                state_00.el_info[4]._3_1_ = (char)((uint)uVar34 >> 0x18);
                state_00.el_info[5].res_level = (short)uVar35;
                state_00.el_info[5].flags = (char)((uint)uVar35 >> 0x10);
                state_00.el_info[5]._3_1_ = (char)((uint)uVar35 >> 0x18);
                state_00.el_info[6].res_level = (short)uVar36;
                state_00.el_info[6].flags = (char)((uint)uVar36 >> 0x10);
                state_00.el_info[6]._3_1_ = (char)((uint)uVar36 >> 0x18);
                state_00.el_info[7].res_level = (short)uVar37;
                state_00.el_info[7].flags = (char)((uint)uVar37 >> 0x10);
                state_00.el_info[7]._3_1_ = (char)((uint)uVar37 >> 0x18);
                state_00.el_info[8].res_level = (short)uVar38;
                state_00.el_info[8].flags = (char)((uint)uVar38 >> 0x10);
                state_00.el_info[8]._3_1_ = (char)((uint)uVar38 >> 0x18);
                state_00.el_info[9].res_level = (short)uVar39;
                state_00.el_info[9].flags = (char)((uint)uVar39 >> 0x10);
                state_00.el_info[9]._3_1_ = (char)((uint)uVar39 >> 0x18);
                state_00.el_info[10].res_level = (short)uVar40;
                state_00.el_info[10].flags = (char)((uint)uVar40 >> 0x10);
                state_00.el_info[10]._3_1_ = (char)((uint)uVar40 >> 0x18);
                state_00.el_info[0xb].res_level = (short)uVar41;
                state_00.el_info[0xb].flags = (char)((uint)uVar41 >> 0x10);
                state_00.el_info[0xb]._3_1_ = (char)((uint)uVar41 >> 0x18);
                state_00.el_info[0xc].res_level = (short)uVar42;
                state_00.el_info[0xc].flags = (char)((uint)uVar42 >> 0x10);
                state_00.el_info[0xc]._3_1_ = (char)((uint)uVar42 >> 0x18);
                state_00.el_info[0xd].res_level = (short)uVar43;
                state_00.el_info[0xd].flags = (char)((uint)uVar43 >> 0x10);
                state_00.el_info[0xd]._3_1_ = (char)((uint)uVar43 >> 0x18);
                state_00.el_info[0xe].res_level = (short)uVar44;
                state_00.el_info[0xe].flags = (char)((uint)uVar44 >> 0x10);
                state_00.el_info[0xe]._3_1_ = (char)((uint)uVar44 >> 0x18);
                state_00.el_info[0xf].res_level = (short)uVar45;
                state_00.el_info[0xf].flags = (char)((uint)uVar45 >> 0x10);
                state_00.el_info[0xf]._3_1_ = (char)((uint)uVar45 >> 0x18);
                state_00.el_info[0x10].res_level = (short)uVar46;
                state_00.el_info[0x10].flags = (char)((uint)uVar46 >> 0x10);
                state_00.el_info[0x10]._3_1_ = (char)((uint)uVar46 >> 0x18);
                state_00.el_info[0x11].res_level = (short)uVar47;
                state_00.el_info[0x11].flags = (char)((uint)uVar47 >> 0x10);
                state_00.el_info[0x11]._3_1_ = (char)((uint)uVar47 >> 0x18);
                state_00.el_info[0x12].res_level = (short)uVar48;
                state_00.el_info[0x12].flags = (char)((uint)uVar48 >> 0x10);
                state_00.el_info[0x12]._3_1_ = (char)((uint)uVar48 >> 0x18);
                state_00.el_info[0x13].res_level = (short)uVar49;
                state_00.el_info[0x13].flags = (char)((uint)uVar49 >> 0x10);
                state_00.el_info[0x13]._3_1_ = (char)((uint)uVar49 >> 0x18);
                state_00.el_info[0x14].res_level = (short)uVar50;
                state_00.el_info[0x14].flags = (char)((uint)uVar50 >> 0x10);
                state_00.el_info[0x14]._3_1_ = (char)((uint)uVar50 >> 0x18);
                state_00.el_info[0x15].res_level = (short)uVar51;
                state_00.el_info[0x15].flags = (char)((uint)uVar51 >> 0x10);
                state_00.el_info[0x15]._3_1_ = (char)((uint)uVar51 >> 0x18);
                state_00.el_info[0x16].res_level = (short)uVar52;
                state_00.el_info[0x16].flags = (char)((uint)uVar52 >> 0x10);
                state_00.el_info[0x16]._3_1_ = (char)((uint)uVar52 >> 0x18);
                state_00.el_info[0x17].res_level = (short)uVar53;
                state_00.el_info[0x17].flags = (char)((uint)uVar53 >> 0x10);
                state_00.el_info[0x17]._3_1_ = (char)((uint)uVar53 >> 0x18);
                state_00.el_info[0x18].res_level = (short)uVar54;
                state_00.el_info[0x18].flags = (char)((uint)uVar54 >> 0x10);
                state_00.el_info[0x18]._3_1_ = (char)((uint)uVar54 >> 0x18);
                state_00.el_info[0x19].res_level = (short)uVar55;
                state_00.el_info[0x19].flags = (char)((uint)uVar55 >> 0x10);
                state_00.el_info[0x19]._3_1_ = (char)((uint)uVar55 >> 0x18);
                state_00.el_info[0x1a].res_level = (short)uVar56;
                state_00.el_info[0x1a].flags = (char)((uint)uVar56 >> 0x10);
                state_00.el_info[0x1a]._3_1_ = (char)((uint)uVar56 >> 0x18);
                state_00.el_info[0x1b].res_level = in_stack_fffffffffffffcd8._310_2_;
                _Var8 = player_resists_effects(state_00,wVar10);
                puVar17 = &pbVar2->lore_attr;
                if (_Var8) {
                  puVar17 = puVar28;
                }
              }
            }
          }
LAB_0017a9b1:
          uVar26 = uVar4 >> 0x20;
          textblock_append_c(tb,*puVar17,"%s",pcVar6);
          textblock_append(tb," (");
          if ((undefined4)uVar4 == 0) {
            if (uVar5 >> 0x20 != 0 || (undefined4)uVar5 != 0 && uVar26 != 0) goto LAB_0017aa44;
          }
          else {
            textblock_append_c(tb,'\r',"%d",uVar4 & 0xffffffff);
LAB_0017aa44:
            if ((undefined4)uVar5 != 0 && uVar26 != 0) {
              textblock_append_c(tb,'\r',"%dd%d",uVar26,uVar5);
            }
            if (uVar5 >> 0x20 != 0) {
              textblock_append_c(tb,'\r',"M%d");
            }
            textblock_append(tb,", ");
          }
          wVar10 = chance_of_monster_hit_base(race,race->blow[uVar19].effect);
          hit_chance(local_170,wVar10,(player->state).to_a + (player->state).ac);
          uVar12 = random_chance_scaled(local_170[0],100);
          textblock_append_c(tb,'\x0e',"%d",(ulong)uVar12);
          textblock_append(tb,"%%)");
          iVar13 = randcalc(v,0,AVERAGE);
          local_1c4 = local_1c4 + iVar13 * uVar12;
        }
        iVar18 = iVar18 + 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < z_info->mon_blows_max);
    uVar12 = local_1c4 / 100;
  }
  textblock_append(tb,", averaging");
  if (iVar25 < iVar24) {
    textblock_append_c(tb,'\x03'," at least");
  }
  textblock_append_c(tb,'\r'," %d",(ulong)uVar12);
  textblock_append(tb," damage on each of %s turns.  ",
                   *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + uVar22 * 0x10));
  return;
}

Assistant:

void lore_append_attack(textblock *tb, const struct monster_race *race,
						const struct monster_lore *lore,
						bitflag known_flags[RF_SIZE])
{
	int i, known_attacks, total_attacks, described_count, total_centidamage;
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Notice lack of attacks */
	if (rf_has(known_flags, RF_NEVER_BLOW)) {
		textblock_append(tb, "%s has no physical attacks.  ",
						 lore_pronoun_nominative(msex, true));
		return;
	}

	total_attacks = 0;
	known_attacks = 0;

	/* Count the number of defined and known attacks */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		/* Skip non-attacks */
		if (!race->blow[i].method) continue;

		total_attacks++;
		if (lore->blow_known[i])
			known_attacks++;
	}

	/* Describe the lack of knowledge */
	if (known_attacks == 0) {
		textblock_append_c(tb, COLOUR_ORANGE, "Nothing is known about %s attack.  ",
						 lore_pronoun_possessive(msex, false));
		return;
	}

	described_count = 0;
	total_centidamage = 99; // round up the final result to the next higher point

	/* Describe each melee attack */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		random_value dice;
		const char *effect_str = NULL;

		/* Skip unknown and undefined attacks */
		if (!race->blow[i].method || !lore->blow_known[i]) continue;

		/* Extract the attack info */
		dice = race->blow[i].dice;
		effect_str = race->blow[i].effect->desc;

		/* Introduce the attack description */
		if (described_count == 0)
			textblock_append(tb, "%s can ",
							 lore_pronoun_nominative(msex, true));
		else if (described_count < known_attacks - 1)
			textblock_append(tb, ", ");
		else
			textblock_append(tb, ", and ");

		/* Describe the method */
		textblock_append(tb, "%s", race->blow[i].method->desc);

		/* Describe the effect (if any) */
		if (effect_str && strlen(effect_str) > 0) {
			int index = blow_index(race->blow[i].effect->name);
			/* Describe the attack type */
			textblock_append(tb, " to ");
			textblock_append_c(tb, blow_color(player, index), "%s", effect_str);

			textblock_append(tb, " (");
			/* Describe damage (if known) */
			if (dice.base || (dice.dice && dice.sides) || dice.m_bonus) {
				if (dice.base)
					textblock_append_c(tb, COLOUR_L_GREEN, "%d", dice.base);

				if (dice.dice && dice.sides)
					textblock_append_c(tb, COLOUR_L_GREEN, "%dd%d", dice.dice, dice.sides);

				if (dice.m_bonus)
					textblock_append_c(tb, COLOUR_L_GREEN, "M%d", dice.m_bonus);

				textblock_append(tb, ", ");
			}

			/* Describe hit chances */
			random_chance c;
			hit_chance(&c, chance_of_monster_hit_base(race, race->blow[i].effect),
				player->state.ac + player->state.to_a);
			int percent = random_chance_scaled(c, 100);
			textblock_append_c(tb, COLOUR_L_BLUE, "%d", percent);
			textblock_append(tb, "%%)");

			total_centidamage += (percent * randcalc(dice, 0, AVERAGE));
		}

		described_count++;
	}

	textblock_append(tb, ", averaging");
	if (known_attacks < total_attacks) {
		textblock_append_c(tb, COLOUR_ORANGE, " at least");
	}
	textblock_append_c(tb, COLOUR_L_GREEN, " %d", total_centidamage/100);
	textblock_append(tb, " damage on each of %s turns.  ",
					 lore_pronoun_possessive(msex, false));
}